

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O0

QByteArray * escapedString(QStringView s)

{
  storage_type_conflict sVar1;
  uchar uVar2;
  int iVar3;
  qsizetype qVar4;
  storage_type_conflict *psVar5;
  uchar *puVar6;
  char *pcVar7;
  qsizetype qVar8;
  QByteArray *this;
  storage_type_conflict *psVar9;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  char16_t u;
  qptrdiff pos;
  char16_t *end;
  uchar *ba_end;
  QByteArray *ba;
  char16_t *src;
  uchar *cursor;
  anon_class_8_1_3fcf64fd ba_const_start;
  char16_t *in_stack_ffffffffffffff18;
  QByteArray *in_stack_ffffffffffffff20;
  uchar **in_stack_ffffffffffffff28;
  QByteArray *in_stack_ffffffffffffff30;
  Initialization in_stack_ffffffffffffff3c;
  undefined2 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff42;
  undefined1 in_stack_ffffffffffffff43;
  undefined4 in_stack_ffffffffffffff44;
  QByteArray *in_stack_ffffffffffffff48;
  byte bStack_75;
  uchar *local_58;
  storage_type_conflict *local_40;
  uchar *local_38;
  int local_24;
  qsizetype local_20;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = QStringView::size(&local_18);
  local_24 = 0x10;
  qMax<long_long,int>(&local_20,&local_24);
  QByteArray::QByteArray
            (in_stack_ffffffffffffff48,
             CONCAT44(in_stack_ffffffffffffff44,
                      CONCAT13(in_stack_ffffffffffffff43,
                               CONCAT12(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40))),
             in_stack_ffffffffffffff3c);
  local_38 = (uchar *)QByteArray::constData((QByteArray *)0x4a4f8a);
  qVar4 = QByteArray::size(in_RDI);
  local_58 = local_38 + qVar4;
  local_40 = QStringView::utf16(&local_18);
  psVar5 = QStringView::utf16(&local_18);
  qVar4 = QStringView::size(&local_18);
  while (local_40 != psVar5 + qVar4) {
    if (local_58 + -6 <= local_38) {
      puVar6 = escapedString::anon_class_8_1_3fcf64fd::operator()
                         ((anon_class_8_1_3fcf64fd *)0x4a5053);
      QByteArray::size(in_RDI);
      QByteArray::resize(in_stack_ffffffffffffff30,(qsizetype)in_stack_ffffffffffffff28);
      pcVar7 = QByteArray::data(in_stack_ffffffffffffff20);
      local_38 = (uchar *)(pcVar7 + ((long)local_38 - (long)puVar6));
      local_58 = escapedString::anon_class_8_1_3fcf64fd::operator()
                           ((anon_class_8_1_3fcf64fd *)0x4a50c1);
      qVar8 = QByteArray::size(in_RDI);
      local_58 = local_58 + qVar8;
    }
    psVar9 = local_40 + 1;
    sVar1 = *local_40;
    local_40 = psVar9;
    if ((ushort)sVar1 < 0x80) {
      if ((((ushort)sVar1 < 0x20) || (sVar1 == L'\"')) || (sVar1 == L'\\')) {
        puVar6 = local_38 + 1;
        *local_38 = '\\';
        if (sVar1 == L'\b') {
          local_38 = local_38 + 2;
          *puVar6 = 'b';
        }
        else if (sVar1 == L'\t') {
          local_38 = local_38 + 2;
          *puVar6 = 't';
        }
        else if (sVar1 == L'\n') {
          local_38 = local_38 + 2;
          *puVar6 = 'n';
        }
        else if (sVar1 == L'\f') {
          local_38 = local_38 + 2;
          *puVar6 = 'f';
        }
        else if (sVar1 == L'\r') {
          local_38 = local_38 + 2;
          *puVar6 = 'r';
        }
        else if (sVar1 == L'\"') {
          local_38 = local_38 + 2;
          *puVar6 = '\"';
        }
        else if (sVar1 == L'\\') {
          local_38 = local_38 + 2;
          *puVar6 = '\\';
        }
        else {
          *puVar6 = 'u';
          local_38[2] = '0';
          local_38[3] = '0';
          uVar2 = hexdig((uint)((ushort)sVar1 >> 4));
          puVar6 = local_38 + 5;
          local_38[4] = uVar2;
          uVar2 = hexdig((ushort)sVar1 & 0xf);
          local_38 = local_38 + 6;
          *puVar6 = uVar2;
        }
      }
      else {
        *local_38 = (uchar)sVar1;
        local_38 = local_38 + 1;
      }
    }
    else {
      iVar3 = QUtf8Functions::toUtf8<QUtf8BaseTraits,unsigned_char*,char16_t_const*>
                        ((char16_t)((ulong)in_stack_ffffffffffffff30 >> 0x10),
                         in_stack_ffffffffffffff28,(char16_t **)in_stack_ffffffffffffff20,
                         in_stack_ffffffffffffff18);
      if (iVar3 < 0) {
        *local_38 = '\\';
        local_38[1] = 'u';
        uVar2 = hexdig((uint)((ushort)sVar1 >> 0xc));
        local_38[2] = uVar2;
        bStack_75 = (byte)((ushort)sVar1 >> 8);
        uVar2 = hexdig(bStack_75 & 0xf);
        local_38[3] = uVar2;
        uVar2 = hexdig((ushort)sVar1 >> 4 & 0xf);
        local_38[4] = uVar2;
        uVar2 = hexdig((ushort)sVar1 & 0xf);
        local_38[5] = uVar2;
        local_38 = local_38 + 6;
      }
    }
  }
  this = (QByteArray *)
         escapedString::anon_class_8_1_3fcf64fd::operator()((anon_class_8_1_3fcf64fd *)0x4a54cd);
  QByteArray::resize(this,(qsizetype)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray escapedString(QStringView s)
{
    // give it a minimum size to ensure the resize() below always adds enough space
    QByteArray ba(qMax(s.size(), 16), Qt::Uninitialized);

    auto ba_const_start = [&]() { return reinterpret_cast<const uchar *>(ba.constData()); };
    uchar *cursor = reinterpret_cast<uchar *>(const_cast<char *>(ba.constData()));
    const uchar *ba_end = cursor + ba.size();
    const char16_t *src = s.utf16();
    const char16_t *const end = s.utf16() + s.size();

    while (src != end) {
        if (cursor >= ba_end - 6) {
            // ensure we have enough space
            qptrdiff pos = cursor - ba_const_start();
            ba.resize(ba.size()*2);
            cursor = reinterpret_cast<uchar *>(ba.data()) + pos;
            ba_end = ba_const_start() + ba.size();
        }

        char16_t u = *src++;
        if (u < 0x80) {
            if (u < 0x20 || u == 0x22 || u == 0x5c) {
                *cursor++ = '\\';
                switch (u) {
                case 0x22:
                    *cursor++ = '"';
                    break;
                case 0x5c:
                    *cursor++ = '\\';
                    break;
                case 0x8:
                    *cursor++ = 'b';
                    break;
                case 0xc:
                    *cursor++ = 'f';
                    break;
                case 0xa:
                    *cursor++ = 'n';
                    break;
                case 0xd:
                    *cursor++ = 'r';
                    break;
                case 0x9:
                    *cursor++ = 't';
                    break;
                default:
                    *cursor++ = 'u';
                    *cursor++ = '0';
                    *cursor++ = '0';
                    *cursor++ = hexdig(u>>4);
                    *cursor++ = hexdig(u & 0xf);
               }
            } else {
                *cursor++ = (uchar)u;
            }
        } else if (QUtf8Functions::toUtf8<QUtf8BaseTraits>(u, cursor, src, end) < 0) {
            // failed to get valid utf8 use JSON escape sequence
            *cursor++ = '\\';
            *cursor++ = 'u';
            *cursor++ = hexdig(u>>12 & 0x0f);
            *cursor++ = hexdig(u>>8 & 0x0f);
            *cursor++ = hexdig(u>>4 & 0x0f);
            *cursor++ = hexdig(u & 0x0f);
        }
    }

    ba.resize(cursor - ba_const_start());
    return ba;
}